

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# font_to_svg.hpp
# Opt level: O0

string * __thiscall font2svg::glyph::outline_abi_cxx11_(string *__return_storage_ptr__,glyph *this)

{
  short sVar1;
  FT_Vector_ *__first;
  char *__first_00;
  short *__first_01;
  vector<short,_std::allocator<short>_> *in_R8;
  vector<char,_std::allocator<char>_> local_d0;
  vector<FT_Vector_,_std::allocator<FT_Vector_>_> local_b8;
  vector<FT_Vector_,_std::allocator<FT_Vector_>_> local_a0;
  allocator<short> local_81;
  undefined1 local_80 [8];
  vector<short,_std::allocator<short>_> contoursv;
  undefined1 local_60 [8];
  vector<char,_std::allocator<char>_> tagsv;
  allocator<FT_Vector_> local_31;
  undefined1 local_30 [8];
  vector<FT_Vector_,_std::allocator<FT_Vector_>_> pointsv;
  glyph *this_local;
  
  __first = this->ftpoints;
  sVar1 = (this->ftoutline).n_points;
  pointsv.super__Vector_base<FT_Vector_,_std::allocator<FT_Vector_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::allocator<FT_Vector_>::allocator(&local_31);
  std::vector<FT_Vector_,std::allocator<FT_Vector_>>::vector<FT_Vector_*,void>
            ((vector<FT_Vector_,std::allocator<FT_Vector_>> *)local_30,__first,__first + sVar1,
             &local_31);
  std::allocator<FT_Vector_>::~allocator(&local_31);
  __first_00 = this->tags;
  sVar1 = (this->ftoutline).n_points;
  std::allocator<char>::allocator();
  std::vector<char,std::allocator<char>>::vector<char*,void>
            ((vector<char,std::allocator<char>> *)local_60,__first_00,__first_00 + sVar1,
             (allocator_type *)
             ((long)&contoursv.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&contoursv.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  __first_01 = this->contours;
  sVar1 = (this->ftoutline).n_contours;
  std::allocator<short>::allocator(&local_81);
  std::vector<short,std::allocator<short>>::vector<short*,void>
            ((vector<short,std::allocator<short>> *)local_80,__first_01,__first_01 + sVar1,&local_81
            );
  std::allocator<short>::~allocator(&local_81);
  std::vector<FT_Vector_,_std::allocator<FT_Vector_>_>::vector
            (&local_a0,(vector<FT_Vector_,_std::allocator<FT_Vector_>_> *)local_30);
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)&local_b8,
             (vector<char,_std::allocator<char>_> *)local_60);
  std::vector<short,_std::allocator<short>_>::vector
            ((vector<short,_std::allocator<short>_> *)&local_d0,
             (vector<short,_std::allocator<short>_> *)local_80);
  do_outline_abi_cxx11_(__return_storage_ptr__,(font2svg *)&local_a0,&local_b8,&local_d0,in_R8);
  std::vector<short,_std::allocator<short>_>::~vector
            ((vector<short,_std::allocator<short>_> *)&local_d0);
  std::vector<char,_std::allocator<char>_>::~vector
            ((vector<char,_std::allocator<char>_> *)&local_b8);
  std::vector<FT_Vector_,_std::allocator<FT_Vector_>_>::~vector(&local_a0);
  std::vector<short,_std::allocator<short>_>::~vector
            ((vector<short,_std::allocator<short>_> *)local_80);
  std::vector<char,_std::allocator<char>_>::~vector((vector<char,_std::allocator<char>_> *)local_60)
  ;
  std::vector<FT_Vector_,_std::allocator<FT_Vector_>_>::~vector
            ((vector<FT_Vector_,_std::allocator<FT_Vector_>_> *)local_30);
  return __return_storage_ptr__;
}

Assistant:

std::string outline()  {
		std::vector<FT_Vector> pointsv(ftpoints,ftpoints+ftoutline.n_points);
		std::vector<char> tagsv(tags,tags+ftoutline.n_points);
		std::vector<short> contoursv(contours,contours+ftoutline.n_contours);
		return do_outline(pointsv, tagsv, contoursv);
	}